

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer_string *pxVar1;
  byte bVar2;
  lexeme_t lVar3;
  lexeme_t lVar4;
  xpath_allocator *__src;
  bool bVar5;
  bool bVar6;
  nodetest_t nVar7;
  char *pcVar8;
  xpath_ast_node *pxVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_parse_result *pxVar12;
  undefined4 uVar13;
  size_t __n;
  xpath_ast_node *pxVar14;
  char *pcVar15;
  xpath_lexer *pxVar16;
  xpath_allocator *local_58;
  char_t *pcStack_50;
  xpath_lexer *local_40;
  undefined4 local_34;
  
  if ((set == (xpath_ast_node *)0x0) || (set->_rettype == '\x01')) {
    pxVar16 = &this->_lexer;
    lVar3 = (this->_lexer)._cur_lexeme;
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next(pxVar16);
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar9 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar9->_type = '8';
        pxVar9->_rettype = '\x01';
        pxVar9->_axis = '\t';
        pxVar9->_test = '\x02';
LAB_00122c72:
        pxVar9->_left = set;
        pxVar9->_right = (xpath_ast_node *)0x0;
        pxVar9->_next = (xpath_ast_node *)0x0;
        (pxVar9->_data).string = (char_t *)0x0;
        return pxVar9;
      }
    }
    else {
      if (lVar3 != lex_dot) {
        pcVar8 = &set->_type;
        if (lVar3 != lex_axis_attribute) {
          local_34 = 3;
        }
        else {
          xpath_lexer::next(pxVar16);
          local_34 = 2;
        }
        local_58 = (xpath_allocator *)0x0;
        pcStack_50 = (char_t *)0x0;
        lVar4 = (this->_lexer)._cur_lexeme;
        local_40 = pxVar16;
        if (lVar4 == lex_multiply) {
          xpath_lexer::next(pxVar16);
          nVar7 = nodetest_all;
          goto LAB_00122ce3;
        }
        pcVar15 = "Unrecognized node test";
        if (lVar4 == lex_string) {
          pxVar1 = &(this->_lexer)._cur_lexeme_contents;
          local_58 = (xpath_allocator *)(this->_lexer)._cur_lexeme_contents.begin;
          pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
          xpath_lexer::next(pxVar16);
          if ((this->_lexer)._cur_lexeme == lex_double_colon) {
            if (lVar3 == lex_axis_attribute) {
              pcVar15 = "Two axis specifiers in one step";
              goto LAB_001230ba;
            }
            bVar2 = *(byte *)&local_58->_root;
            if (bVar2 < 0x6e) {
              switch(bVar2) {
              case 0x61:
                pcVar8 = "ancestor";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,"ancestor");
                uVar13 = 0;
                bVar5 = true;
                if (!bVar6) {
                  pcVar8 = "ancestor-or-self";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                     "ancestor-or-self");
                  uVar13 = 1;
                  if (!bVar6) {
                    pcVar8 = "attribute";
                    bVar6 = xpath_lexer_string::operator==
                                      ((xpath_lexer_string *)&stack0xffffffffffffffa8,"attribute");
                    uVar13 = 2;
                    goto LAB_00123077;
                  }
                }
                break;
              default:
                goto switchD_00122e64_caseD_62;
              case 99:
                pcVar8 = "child";
                bVar5 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,"child");
                if (!bVar5) goto switchD_00122e64_caseD_62;
                uVar13 = 3;
LAB_0012302b:
                bVar5 = true;
                break;
              case 100:
                pcVar8 = "descendant";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,"descendant");
                uVar13 = 4;
                bVar5 = true;
                if (!bVar6) {
                  pcVar8 = "descendant-or-self";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                     "descendant-or-self");
                  uVar13 = 5;
LAB_00123077:
                  bVar5 = true;
                  if (bVar6 == false) goto switchD_00122e64_caseD_62;
                }
                break;
              case 0x66:
                pcVar8 = "following";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,"following");
                uVar13 = 6;
                bVar5 = true;
                if (!bVar6) {
                  pcVar8 = "following-sibling";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                     "following-sibling");
                  uVar13 = 7;
                  goto LAB_00123077;
                }
              }
            }
            else {
              if (bVar2 == 0x6e) {
                pcVar8 = "namespace";
                bVar5 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,"namespace");
                if (bVar5) {
                  uVar13 = 8;
                  goto LAB_0012302b;
                }
              }
              else {
                if (bVar2 == 0x70) {
                  pcVar8 = "parent";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,"parent");
                  uVar13 = 9;
                  bVar5 = true;
                  if (!bVar6) {
                    pcVar8 = "preceding";
                    bVar6 = xpath_lexer_string::operator==
                                      ((xpath_lexer_string *)&stack0xffffffffffffffa8,"preceding");
                    uVar13 = 10;
                    if (!bVar6) {
                      pcVar8 = "preceding-sibling";
                      bVar6 = xpath_lexer_string::operator==
                                        ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                         "preceding-sibling");
                      uVar13 = 0xb;
                      goto LAB_00123077;
                    }
                  }
                  goto LAB_00123082;
                }
                if (bVar2 == 0x73) {
                  pcVar8 = "self";
                  bVar5 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,"self");
                  if (bVar5) {
                    uVar13 = 0xc;
                    goto LAB_0012302b;
                  }
                }
              }
switchD_00122e64_caseD_62:
              uVar13 = 3;
              bVar5 = false;
            }
LAB_00123082:
            if (!bVar5) {
              pcVar15 = "Unknown axis";
              goto LAB_001230ba;
            }
            local_34 = uVar13;
            xpath_lexer::next(local_40);
            pxVar16 = local_40;
            lVar3 = (this->_lexer)._cur_lexeme;
            if (lVar3 == lex_string) {
              local_58 = (xpath_allocator *)pxVar1->begin;
              pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
              nVar7 = nodetest_none;
              bVar5 = true;
            }
            else {
              if (lVar3 != lex_multiply) goto LAB_001230ba;
              local_58 = (xpath_allocator *)0x0;
              pcStack_50 = (char_t *)0x0;
              nVar7 = nodetest_all;
              bVar5 = false;
            }
            xpath_lexer::next(local_40);
          }
          else {
            nVar7 = nodetest_none;
            bVar5 = true;
            pxVar16 = local_40;
          }
          if (!bVar5) {
LAB_00122ce3:
            __src = local_58;
            if (local_58 == (xpath_allocator *)0x0) {
              pcVar8 = "";
            }
            else {
              __n = (long)pcStack_50 - (long)local_58;
              pcVar8 = (char *)xpath_allocator::allocate(this->_alloc,__n + 1);
              if (pcVar8 == (char *)0x0) {
                pcVar8 = (char *)0x0;
              }
              else {
                memcpy(pcVar8,__src,__n);
                pcVar8[__n] = '\0';
              }
            }
            if (pcVar8 == (char *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar9 == (xpath_ast_node *)0x0) {
              pxVar9 = (xpath_ast_node *)0x0;
            }
            else {
              pxVar9->_type = '8';
              pxVar9->_rettype = '\x01';
              pxVar9->_axis = (char)local_34;
              pxVar9->_test = (char)nVar7;
              pxVar9->_left = set;
              pxVar9->_right = (xpath_ast_node *)0x0;
              pxVar9->_next = (xpath_ast_node *)0x0;
              (pxVar9->_data).string = pcVar8;
            }
            if (pxVar9 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar14 = (xpath_ast_node *)0x0;
            pxVar16 = local_40;
            do {
              if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
                return pxVar9;
              }
              xpath_lexer::next(pxVar16);
              bVar5 = false;
              pxVar10 = parse_expression(this,0);
              pxVar16 = local_40;
              if (pxVar10 != (xpath_ast_node *)0x0) {
                pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                pxVar16 = local_40;
                if (pxVar11 == (xpath_ast_node *)0x0) {
                  pxVar11 = (xpath_ast_node *)0x0;
                }
                else {
                  pxVar11->_type = '\x10';
                  pxVar11->_rettype = '\x01';
                  pxVar11->_axis = '\0';
                  pxVar11->_test = '\0';
                  pxVar11->_left = (xpath_ast_node *)0x0;
                  pxVar11->_right = pxVar10;
                  pxVar11->_next = (xpath_ast_node *)0x0;
                }
                if (pxVar11 != (xpath_ast_node *)0x0) {
                  if ((this->_lexer)._cur_lexeme == lex_close_square_brace) {
                    xpath_lexer::next(local_40);
                    if (pxVar14 == (xpath_ast_node *)0x0) {
                      pxVar9->_right = pxVar11;
                    }
                    else {
                      pxVar14->_next = pxVar11;
                    }
                    bVar5 = true;
                    pxVar14 = pxVar11;
                    goto LAB_00122e2c;
                  }
                  pxVar12 = this->_result;
                  pxVar12->error = "Expected \']\' to match an opening \'[\'";
                  pxVar12->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
                }
                bVar5 = false;
              }
LAB_00122e2c:
              if (!bVar5) {
                return (xpath_ast_node *)0x0;
              }
            } while( true );
          }
          if ((this->_lexer)._cur_lexeme != lex_open_brace) {
            nVar7 = nodetest_name;
            if (((2 < (long)pcStack_50 - (long)local_58) && (pcStack_50[-2] == ':')) &&
               (pcStack_50[-1] == '*')) {
              pcStack_50 = pcStack_50 + -1;
              nVar7 = nodetest_all_in_namespace;
            }
            goto LAB_00122ce3;
          }
          xpath_lexer::next(pxVar16);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_close_brace) {
            xpath_lexer::next(pxVar16);
            nVar7 = parse_node_test_type
                              ((xpath_parser *)&stack0xffffffffffffffa8,(xpath_lexer_string *)pcVar8
                              );
            if (nVar7 != nodetest_none) {
              local_58 = (xpath_allocator *)0x0;
              pcStack_50 = (char_t *)0x0;
              goto LAB_00122ce3;
            }
            pcVar15 = "Unrecognized node type";
          }
          else {
            bVar5 = xpath_lexer_string::operator==
                              ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                               "processing-instruction");
            if (bVar5) {
              if (lVar3 == lex_quoted_string) {
                local_58 = (xpath_allocator *)pxVar1->begin;
                pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
                xpath_lexer::next(pxVar16);
                if ((this->_lexer)._cur_lexeme == lex_close_brace) {
                  xpath_lexer::next(pxVar16);
                  nVar7 = nodetest_pi;
                  goto LAB_00122ce3;
                }
                pcVar15 = "Unmatched brace near processing-instruction()";
              }
              else {
                pcVar15 = "Only literals are allowed as arguments to processing-instruction()";
              }
            }
            else {
              pcVar15 = "Unmatched brace near node type test";
            }
          }
        }
LAB_001230ba:
        pxVar12 = this->_result;
        pxVar12->error = pcVar15;
        goto LAB_001230c1;
      }
      xpath_lexer::next(pxVar16);
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar9 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar9->_type = '8';
        pxVar9->_rettype = '\x01';
        pxVar9->_axis = '\f';
        pxVar9->_test = '\x02';
        goto LAB_00122c72;
      }
    }
    pxVar12 = this->_result;
    pcVar8 = "Predicates are not allowed after an abbreviated step";
  }
  else {
    pxVar12 = this->_result;
    pcVar8 = "Step has to be applied to node set";
  }
  pxVar12->error = pcVar8;
LAB_001230c1:
  pxVar12->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return 0;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return 0;

			xpath_ast_node* last = 0;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return 0;

				xpath_ast_node* pred = alloc_node(ast_predicate, 0, expr, predicate_default);
				if (!pred) return 0;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			return n;
		}